

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

bool __thiscall
QSocks5SocketEngine::waitForWrite(QSocks5SocketEngine *this,QDeadlineTimer deadline,bool *timedOut)

{
  QTcpSocket *pQVar1;
  QDeadlineTimer deadline_00;
  bool bVar2;
  SocketState SVar3;
  undefined4 uVar4;
  QSocks5SocketEnginePrivate *pQVar5;
  long lVar6;
  qint64 in_RDX;
  long in_FS_OFFSET;
  qint64 remainingTime;
  anon_class_8_1_54a39804 shouldWriteBytes;
  QSocks5SocketEnginePrivate *d;
  bool local_61;
  QTcpSocket *in_stack_ffffffffffffffa0;
  ulong local_58;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  QSocks5SocketEnginePrivate *in_stack_ffffffffffffffc8;
  long lVar7;
  
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QSocks5SocketEngine *)0x375084);
  deadline_00.t2 = (int)lVar7;
  deadline_00.type = (int)((ulong)lVar7 >> 0x20);
  deadline_00.t1 = in_RDX;
  bVar2 = QSocks5SocketEnginePrivate::waitForConnected
                    (in_stack_ffffffffffffffc8,deadline_00,
                     (bool *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  if (bVar2) {
    SVar3 = QAbstractSocket::state((QAbstractSocket *)0x3750d8);
    if (SVar3 == UnconnectedState) {
      bVar2 = true;
    }
    else {
      lVar6 = (**(code **)(*(long *)&pQVar5->data->controlSocket->super_QAbstractSocket + 0xa8))();
      if (lVar6 != 0) {
        in_stack_ffffffffffffffa0 = pQVar5->data->controlSocket;
        uVar4 = QDeadlineTimer::remainingTime();
        (**(code **)(*(long *)&in_stack_ffffffffffffffa0->super_QAbstractSocket + 0xc0))
                  (in_stack_ffffffffffffffa0,uVar4);
      }
      local_58 = QDeadlineTimer::remainingTime();
      while( true ) {
        local_61 = false;
        if (0 < (long)local_58) {
          local_61 = waitForWrite::anon_class_8_1_54a39804::operator()
                               ((anon_class_8_1_54a39804 *)in_stack_ffffffffffffffa0);
        }
        if (local_61 == false) break;
        pQVar1 = pQVar5->data->controlSocket;
        (**(code **)(*(long *)&pQVar1->super_QAbstractSocket + 0xc0))(pQVar1,local_58 & 0xffffffff);
        local_58 = QDeadlineTimer::remainingTime();
      }
      lVar6 = (**(code **)(*(long *)&pQVar5->data->controlSocket->super_QAbstractSocket + 0xa8))();
      bVar2 = lVar6 < 0x20000;
    }
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar7) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5SocketEngine::waitForWrite(QDeadlineTimer deadline, bool *timedOut)
{
    Q_D(QSocks5SocketEngine);
    QSOCKS5_DEBUG << "waitForWrite" << deadline.remainingTimeAsDuration();

    // are we connected yet?
    if (!d->waitForConnected(deadline, timedOut))
        return false;
    if (d->data->controlSocket->state() == QAbstractSocket::UnconnectedState)
        return true;

    // we're connected

    // flush any bytes we may still have buffered in the time that we have left
    if (d->data->controlSocket->bytesToWrite())
        d->data->controlSocket->waitForBytesWritten(deadline.remainingTime());

    auto shouldWriteBytes = [&]() {
        return d->data->controlSocket->state() == QAbstractSocket::ConnectedState
                && d->data->controlSocket->bytesToWrite() >= MaxWriteBufferSize;
    };

    qint64 remainingTime = deadline.remainingTime();
    for (; remainingTime > 0 && shouldWriteBytes(); remainingTime = deadline.remainingTime())
        d->data->controlSocket->waitForBytesWritten(remainingTime);
    return d->data->controlSocket->bytesToWrite() < MaxWriteBufferSize;
}